

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_enc.c
# Opt level: O0

int BackwardReferencesRle(int xsize,int ysize,uint32_t *argb,int cache_bits,VP8LBackwardRefs *refs)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  PixOrCopy PVar4;
  int in_ECX;
  int in_ESI;
  uint32_t in_EDI;
  PixOrCopy in_R8;
  int prev_row_len;
  int rle_len;
  int max_len;
  VP8LColorCache hashers;
  int use_color_cache;
  int k;
  int i;
  int pix_count;
  PixOrCopy in_stack_ffffffffffffff88;
  PixOrCopy in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  VP8LColorCache *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc0;
  uint32_t in_stack_ffffffffffffffc4;
  int local_34;
  int local_30;
  uint local_4;
  
  bVar1 = 0 < in_ECX;
  if ((bVar1) &&
     (iVar2 = VP8LColorCacheInit((VP8LColorCache *)in_stack_ffffffffffffff88,0), iVar2 == 0)) {
    local_4 = 0;
  }
  else {
    VP8LClearBackwardRefs((VP8LBackwardRefs *)in_R8);
    AddSingleLiteral(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                     (VP8LBackwardRefs *)
                     CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    local_30 = 1;
    while (local_30 < (int)(in_EDI * in_ESI)) {
      iVar2 = MaxFindCopyLength(in_EDI * in_ESI - local_30);
      iVar3 = FindMatchLength((uint32_t *)
                              CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                              (uint32_t *)in_stack_ffffffffffffff90,
                              in_stack_ffffffffffffff88.argb_or_distance,
                              in_stack_ffffffffffffff88._0_4_);
      if (local_30 < (int)in_EDI) {
        in_stack_ffffffffffffff98 = 0;
      }
      else {
        in_stack_ffffffffffffff98 =
             FindMatchLength((uint32_t *)
                             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                             (uint32_t *)in_stack_ffffffffffffff90,
                             in_stack_ffffffffffffff88.argb_or_distance,
                             in_stack_ffffffffffffff88._0_4_);
      }
      if ((iVar3 < in_stack_ffffffffffffff98) || (iVar3 < 4)) {
        if (in_stack_ffffffffffffff98 < 4) {
          AddSingleLiteral(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,
                           in_stack_ffffffffffffffb8,(VP8LBackwardRefs *)CONCAT44(iVar2,iVar3));
          local_30 = local_30 + 1;
        }
        else {
          in_stack_ffffffffffffff88 = in_R8;
          iVar2 = in_stack_ffffffffffffff98;
          PVar4 = PixOrCopyCreateCopy(in_EDI,(uint16_t)in_stack_ffffffffffffff98);
          in_stack_ffffffffffffff9c = PVar4._0_4_;
          VP8LBackwardRefsCursorAdd
                    ((VP8LBackwardRefs *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff90);
          if (bVar1) {
            for (local_34 = 0; local_34 < in_stack_ffffffffffffff98; local_34 = local_34 + 1) {
              VP8LColorCacheInsert
                        ((VP8LColorCache *)in_stack_ffffffffffffff90,
                         in_stack_ffffffffffffff88.argb_or_distance);
            }
          }
          local_30 = in_stack_ffffffffffffff98 + local_30;
          in_stack_ffffffffffffff98 = iVar2;
        }
      }
      else {
        in_stack_ffffffffffffff90 = in_R8;
        PixOrCopyCreateCopy(1,(uint16_t)iVar3);
        VP8LBackwardRefsCursorAdd
                  ((VP8LBackwardRefs *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff90);
        local_30 = iVar3 + local_30;
      }
    }
    if (bVar1) {
      VP8LColorCacheClear((VP8LColorCache *)0x18fed5);
    }
    local_4 = (uint)((*(int *)((long)in_R8 + 4) != 0 ^ 0xffU) & 1);
  }
  return local_4;
}

Assistant:

static int BackwardReferencesRle(int xsize, int ysize,
                                 const uint32_t* const argb,
                                 int cache_bits, VP8LBackwardRefs* const refs) {
  const int pix_count = xsize * ysize;
  int i, k;
  const int use_color_cache = (cache_bits > 0);
  VP8LColorCache hashers;

  if (use_color_cache && !VP8LColorCacheInit(&hashers, cache_bits)) {
    return 0;
  }
  VP8LClearBackwardRefs(refs);
  // Add first pixel as literal.
  AddSingleLiteral(argb[0], use_color_cache, &hashers, refs);
  i = 1;
  while (i < pix_count) {
    const int max_len = MaxFindCopyLength(pix_count - i);
    const int rle_len = FindMatchLength(argb + i, argb + i - 1, 0, max_len);
    const int prev_row_len = (i < xsize) ? 0 :
        FindMatchLength(argb + i, argb + i - xsize, 0, max_len);
    if (rle_len >= prev_row_len && rle_len >= MIN_LENGTH) {
      VP8LBackwardRefsCursorAdd(refs, PixOrCopyCreateCopy(1, rle_len));
      // We don't need to update the color cache here since it is always the
      // same pixel being copied, and that does not change the color cache
      // state.
      i += rle_len;
    } else if (prev_row_len >= MIN_LENGTH) {
      VP8LBackwardRefsCursorAdd(refs, PixOrCopyCreateCopy(xsize, prev_row_len));
      if (use_color_cache) {
        for (k = 0; k < prev_row_len; ++k) {
          VP8LColorCacheInsert(&hashers, argb[i + k]);
        }
      }
      i += prev_row_len;
    } else {
      AddSingleLiteral(argb[i], use_color_cache, &hashers, refs);
      i++;
    }
  }
  if (use_color_cache) VP8LColorCacheClear(&hashers);
  return !refs->error;
}